

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

int Smt_StrToType(char *pName,int *pfSigned)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  *pfSigned = 0;
  iVar2 = strcmp(pName,"ite");
  if (iVar2 == 0) {
    return 8;
  }
  iVar2 = strcmp(pName,"bvlshr");
  if (iVar2 == 0) {
    return 9;
  }
  iVar2 = strcmp(pName,"bvashr");
  if (iVar2 == 0) {
    *pfSigned = 1;
    return 10;
  }
  iVar2 = strcmp(pName,"bvshl");
  if (iVar2 == 0) {
    return 0xb;
  }
  iVar2 = strcmp(pName,"rotate_right");
  if (iVar2 == 0) {
    return 0xd;
  }
  iVar2 = strcmp(pName,"rotate_left");
  if (iVar2 == 0) {
    return 0xe;
  }
  iVar2 = strcmp(pName,"bvnot");
  if (iVar2 == 0) {
    return 0xf;
  }
  iVar2 = strcmp(pName,"bvand");
  if (iVar2 == 0) {
    return 0x10;
  }
  iVar2 = strcmp(pName,"bvor");
  if (iVar2 == 0) {
    return 0x11;
  }
  iVar2 = strcmp(pName,"bvxor");
  if (iVar2 == 0) {
    return 0x12;
  }
  iVar2 = strcmp(pName,"bvnand");
  if (iVar2 == 0) {
    return 0x13;
  }
  iVar2 = strcmp(pName,"bvnor");
  if (iVar2 == 0) {
    return 0x14;
  }
  iVar2 = strcmp(pName,"bvxnor");
  if (iVar2 == 0) {
    return 0x15;
  }
  iVar2 = strcmp(pName,"extract");
  if (iVar2 == 0) {
    return 0x16;
  }
  iVar2 = strcmp(pName,"concat");
  if (iVar2 == 0) {
    return 0x17;
  }
  iVar2 = strcmp(pName,"zero_extend");
  if (iVar2 == 0) {
    return 0x18;
  }
  iVar2 = strcmp(pName,"sign_extend");
  if (iVar2 == 0) {
    return 0x19;
  }
  iVar2 = strcmp(pName,"not");
  if (iVar2 == 0) {
    return 0x1a;
  }
  cVar1 = *pName;
  if (((cVar1 == '=') && (pName[1] == '>')) && (pName[2] == '\0')) {
    return 0x1b;
  }
  iVar2 = strcmp(pName,"and");
  if (iVar2 == 0) {
    return 0x1c;
  }
  if (((cVar1 == 'o') && (pName[1] == 'r')) && (pName[2] == '\0')) {
    return 0x1d;
  }
  iVar2 = strcmp(pName,"xor");
  if (iVar2 == 0) {
    return 0x1e;
  }
  iVar2 = strcmp(pName,"bvcomp");
  if (iVar2 == 0) {
    return 0x1f;
  }
  if ((cVar1 == '=') && (pName[1] == '\0')) {
    return 0x1f;
  }
  iVar2 = strcmp(pName,"distinct");
  if (iVar2 == 0) {
    return 0x20;
  }
  iVar2 = strcmp(pName,"bvult");
  iVar4 = 0x21;
  if (iVar2 == 0) {
    return 0x21;
  }
  iVar3 = strcmp(pName,"bvugt");
  iVar2 = 0x22;
  if (iVar3 == 0) {
    return 0x22;
  }
  iVar3 = strcmp(pName,"bvule");
  if (iVar3 == 0) {
LAB_00310dc0:
    iVar2 = 0x23;
  }
  else {
    iVar3 = strcmp(pName,"bvuge");
    if (iVar3 == 0) {
      return 0x24;
    }
    iVar3 = strcmp(pName,"bvslt");
    if (iVar3 == 0) {
LAB_00310da4:
      *pfSigned = 1;
      return iVar4;
    }
    iVar4 = strcmp(pName,"bvsgt");
    if (iVar4 != 0) {
      iVar2 = strcmp(pName,"bvsle");
      if (iVar2 == 0) {
        *pfSigned = 1;
        goto LAB_00310dc0;
      }
      iVar2 = strcmp(pName,"bvsge");
      if (iVar2 == 0) {
        *pfSigned = 1;
        return 0x24;
      }
      iVar2 = strcmp(pName,"bvredand");
      if (iVar2 == 0) {
        return 0x25;
      }
      iVar2 = strcmp(pName,"bvredor");
      if (iVar2 == 0) {
        return 0x26;
      }
      iVar2 = strcmp(pName,"bvredxor");
      if (iVar2 == 0) {
        return 0x27;
      }
      iVar2 = strcmp(pName,"bvadd");
      if (iVar2 == 0) {
        return 0x2b;
      }
      iVar2 = strcmp(pName,"bvsub");
      if (iVar2 == 0) {
        return 0x2c;
      }
      iVar2 = strcmp(pName,"bvmul");
      if (iVar2 == 0) {
        return 0x2d;
      }
      iVar2 = strcmp(pName,"bvudiv");
      iVar4 = 0x2e;
      if (iVar2 == 0) {
        return 0x2e;
      }
      iVar3 = strcmp(pName,"bvurem");
      iVar2 = 0x2f;
      if (iVar3 == 0) {
        return 0x2f;
      }
      iVar3 = strcmp(pName,"bvsdiv");
      if (iVar3 == 0) goto LAB_00310da4;
      iVar4 = strcmp(pName,"bvsrem");
      if (iVar4 != 0) {
        iVar2 = strcmp(pName,"bvsmod");
        if (iVar2 == 0) {
          *pfSigned = 1;
          return 0x30;
        }
        iVar2 = strcmp(pName,"bvneg");
        if (iVar2 != 0) {
          printf("The following operations is currently not supported (%s)\n",pName);
          fflush(_stdout);
          return 0;
        }
        return 0x32;
      }
    }
    *pfSigned = 1;
  }
  return iVar2;
}

Assistant:

static inline int Smt_StrToType( char * pName, int * pfSigned )
{
    int Type = 0; *pfSigned = 0;
    if ( !strcmp(pName, "ite") )
        Type = WLC_OBJ_MUX;           // 08: multiplexer
    else if ( !strcmp(pName, "bvlshr") )
        Type = WLC_OBJ_SHIFT_R;       // 09: shift right
    else if ( !strcmp(pName, "bvashr") )
        Type = WLC_OBJ_SHIFT_RA , *pfSigned = 1;      // 10: shift right (arithmetic)
    else if ( !strcmp(pName, "bvshl") )
        Type = WLC_OBJ_SHIFT_L;       // 11: shift left
//    else if ( !strcmp(pName, "") )
//        Type = WLC_OBJ_SHIFT_LA;    // 12: shift left (arithmetic)
    else if ( !strcmp(pName, "rotate_right") )
        Type = WLC_OBJ_ROTATE_R;      // 13: rotate right
    else if ( !strcmp(pName, "rotate_left") )
        Type = WLC_OBJ_ROTATE_L;      // 14: rotate left
    else if ( !strcmp(pName, "bvnot") )
        Type = WLC_OBJ_BIT_NOT;       // 15: bitwise NOT
    else if ( !strcmp(pName, "bvand") )
        Type = WLC_OBJ_BIT_AND;       // 16: bitwise AND
    else if ( !strcmp(pName, "bvor") )
        Type = WLC_OBJ_BIT_OR;        // 17: bitwise OR
    else if ( !strcmp(pName, "bvxor") )
        Type = WLC_OBJ_BIT_XOR;       // 18: bitwise XOR
    else if ( !strcmp(pName, "bvnand") )
        Type = WLC_OBJ_BIT_NAND;      // 16: bitwise NAND
    else if ( !strcmp(pName, "bvnor") )
        Type = WLC_OBJ_BIT_NOR;       // 17: bitwise NOR
    else if ( !strcmp(pName, "bvxnor") )
        Type = WLC_OBJ_BIT_NXOR;      // 18: bitwise NXOR
    else if ( !strcmp(pName, "extract") )
        Type = WLC_OBJ_BIT_SELECT;    // 19: bit selection
    else if ( !strcmp(pName, "concat") )
        Type = WLC_OBJ_BIT_CONCAT;    // 20: bit concatenation
    else if ( !strcmp(pName, "zero_extend") )
        Type = WLC_OBJ_BIT_ZEROPAD;   // 21: zero padding
    else if ( !strcmp(pName, "sign_extend") )
        Type = WLC_OBJ_BIT_SIGNEXT;   // 22: sign extension
    else if ( !strcmp(pName, "not") )
        Type = WLC_OBJ_LOGIC_NOT;     // 23: logic NOT
    else if ( !strcmp(pName, "=>") )
        Type = WLC_OBJ_LOGIC_IMPL;    // 24: logic AND
    else if ( !strcmp(pName, "and") )
        Type = WLC_OBJ_LOGIC_AND;     // 24: logic AND
    else if ( !strcmp(pName, "or") )
        Type = WLC_OBJ_LOGIC_OR;      // 25: logic OR
    else if ( !strcmp(pName, "xor") )
        Type = WLC_OBJ_LOGIC_XOR;     // 26: logic OR
    else if ( !strcmp(pName, "bvcomp") || !strcmp(pName, "=") )
        Type = WLC_OBJ_COMP_EQU;      // 27: compare equal
    else if ( !strcmp(pName, "distinct") )
        Type = WLC_OBJ_COMP_NOTEQU;   // 28: compare not equal
    else if ( !strcmp(pName, "bvult") )
        Type = WLC_OBJ_COMP_LESS;     // 29: compare less
    else if ( !strcmp(pName, "bvugt") )
        Type = WLC_OBJ_COMP_MORE;     // 30: compare more
    else if ( !strcmp(pName, "bvule") )
        Type = WLC_OBJ_COMP_LESSEQU;  // 31: compare less or equal
    else if ( !strcmp(pName, "bvuge") )
        Type = WLC_OBJ_COMP_MOREEQU;  // 32: compare more or equal
    else if ( !strcmp(pName, "bvslt") )
        Type = WLC_OBJ_COMP_LESS, *pfSigned = 1;     // 29: compare less
    else if ( !strcmp(pName, "bvsgt") )
        Type = WLC_OBJ_COMP_MORE, *pfSigned = 1;     // 30: compare more
    else if ( !strcmp(pName, "bvsle") )
        Type = WLC_OBJ_COMP_LESSEQU, *pfSigned = 1;  // 31: compare less or equal
    else if ( !strcmp(pName, "bvsge") )
        Type = WLC_OBJ_COMP_MOREEQU, *pfSigned = 1;  // 32: compare more or equal
    else if ( !strcmp(pName, "bvredand") )
        Type = WLC_OBJ_REDUCT_AND;    // 33: reduction AND
    else if ( !strcmp(pName, "bvredor") )
        Type = WLC_OBJ_REDUCT_OR;     // 34: reduction OR
    else if ( !strcmp(pName, "bvredxor") )
        Type = WLC_OBJ_REDUCT_XOR;    // 35: reduction XOR
    else if ( !strcmp(pName, "bvadd") )
        Type = WLC_OBJ_ARI_ADD;       // 36: arithmetic addition
    else if ( !strcmp(pName, "bvsub") )
        Type = WLC_OBJ_ARI_SUB;       // 37: arithmetic subtraction
    else if ( !strcmp(pName, "bvmul") )
        Type = WLC_OBJ_ARI_MULTI;     // 38: arithmetic multiplier
    else if ( !strcmp(pName, "bvudiv") )
        Type = WLC_OBJ_ARI_DIVIDE;    // 39: arithmetic division
    else if ( !strcmp(pName, "bvurem") )
        Type = WLC_OBJ_ARI_REM;       // 40: arithmetic remainder
    else if ( !strcmp(pName, "bvsdiv") )
        Type = WLC_OBJ_ARI_DIVIDE, *pfSigned = 1;    // 39: arithmetic division
    else if ( !strcmp(pName, "bvsrem") )
        Type = WLC_OBJ_ARI_REM, *pfSigned = 1;       // 40: arithmetic remainder
    else if ( !strcmp(pName, "bvsmod") )
        Type = WLC_OBJ_ARI_MODULUS, *pfSigned = 1;   // 40: arithmetic modulus
    else if ( !strcmp(pName, "=") )
        Type = WLC_OBJ_COMP_EQU;   // 40: arithmetic modulus
//    else if ( !strcmp(pName, "") )
//        Type = WLC_OBJ_ARI_POWER;     // 41: arithmetic power
    else if ( !strcmp(pName, "bvneg") )
        Type = WLC_OBJ_ARI_MINUS;       // 42: arithmetic minus
//    else if ( !strcmp(pName, "") )
//        Type = WLC_OBJ_TABLE;         // 43: bit table
    else
    {
        printf( "The following operations is currently not supported (%s)\n", pName );
        fflush( stdout );
    }
    return Type;
}